

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::AddLRF(BayesianGameCollaborativeGraphical *this,Scope *s)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  BayesianGameIdenticalPayoff *this_00;
  undefined8 *puVar7;
  unsigned_long *puVar8;
  ulong uVar9;
  size_t nrAgents;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrActions;
  Scope sSorted;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  Scope local_50;
  BayesianGameIdenticalPayoff *local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50.super_SDT,&s->super_SDT);
  Scope::Sort(&local_50);
  bVar4 = Scope::Equals(&local_50,s);
  if (!bVar4) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar7 = &PTR__E_0059bd80;
    puVar7[1] = puVar7 + 3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar7 + 1),
               "BayesianGameCollaborativeGraphical::AddLRF() Scope should always be sorted","");
    __cxa_throw(puVar7,&E::typeinfo,E::~E);
  }
  puVar2 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != puVar2) {
    uVar1 = puVar2[-1];
    iVar5 = (*(this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])(this);
    if (CONCAT44(extraout_var,iVar5) <= (ulong)uVar1) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
      *puVar7 = &PTR__E_0059bd80;
      puVar7[1] = puVar7 + 3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(puVar7 + 1),
                 "BayesianGameCollaborativeGraphical::AddLRF() Scope contains non-existing agent!",
                 "");
      __cxa_throw(puVar7,&E::typeinfo,E::~E);
    }
  }
  this->_m_nrLRFs = this->_m_nrLRFs + 1;
  puVar2 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  nrAgents = (long)puVar2 - (long)puVar3 >> 2;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  if (puVar2 != puVar3) {
    uVar6 = 0;
    uVar9 = 1;
    do {
      uVar1 = (s->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[uVar6];
      puVar8 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
               _m_nrActions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar1;
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,puVar8);
      }
      else {
        *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = *puVar8;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      puVar8 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrTypes.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar1;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,puVar8);
      }
      else {
        *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = *puVar8;
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      bVar4 = uVar9 < nrAgents;
      uVar6 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar4);
  }
  this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (this_00,nrAgents,&local_68,&local_88,true);
  local_38 = this_00;
  std::vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>>::
  emplace_back<BayesianGameIdenticalPayoff*>
            ((vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>> *)
             &this->_m_LRFs,&local_38);
  std::vector<Scope,_std::allocator<Scope>_>::push_back(&this->_m_agentScopes,s);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void 
BayesianGameCollaborativeGraphical::AddLRF(const Scope &s)
{
    // check whether the scope is sorted, i.e., agent indices are in
    // ascending order
    Scope sSorted=s;
    sSorted.Sort();
    if(!sSorted.Equals(s))
        throw(E("BayesianGameCollaborativeGraphical::AddLRF() Scope should always be sorted"));

    if(! s.empty() )
    {
        Index highestAgentI = s.at(s.size()-1);
        if (highestAgentI >= GetNrAgents() )
            throw(E("BayesianGameCollaborativeGraphical::AddLRF() Scope contains non-existing agent!"));
    }

    _m_nrLRFs++;
    size_t nrAgentsThisLRF = s.size();
    vector<size_t> nrActions;
    vector<size_t> nrTypes;
    for(Index s_I = 0; s_I < nrAgentsThisLRF; s_I++)
    {
        Index agentI=s[s_I];
        nrActions.push_back( _m_nrActions[agentI] );
        nrTypes.push_back( _m_nrTypes[agentI] );
    }
    bool useSparseRewardModel=true;
    _m_LRFs.push_back( new BayesianGameIdenticalPayoff(nrAgentsThisLRF,
                                                       nrActions, nrTypes,
                                                       useSparseRewardModel ) );
    _m_agentScopes.push_back(s);
}